

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)

{
  uint8_t uVar1;
  fdb_file_handle *pfVar2;
  filemgr *pfVar3;
  fdb_custom_cmp_variable p_Var4;
  void *pvVar5;
  list *plVar6;
  list_elem *plVar7;
  list_elem *plVar8;
  list_elem *plVar9;
  ulong uVar10;
  fdb_custom_cmp_variable p_Var11;
  avl_node *paVar12;
  int iVar13;
  fdb_status fVar14;
  avl_node *paVar15;
  avl_node *paVar16;
  char *pcVar17;
  kvs_header *pkVar18;
  size_t line_number;
  char *pcVar19;
  kvs_node query;
  
  pfVar2 = handle->fhandle;
  pfVar3 = handle->file;
  pthread_spin_lock(&pfVar3->kv_header->lock);
  pkVar18 = pfVar3->kv_header;
  uVar1 = pkVar18->custom_cmp_enabled;
  p_Var4 = pkVar18->default_kvs_cmp;
  pvVar5 = pkVar18->default_kvs_cmp_param;
  plVar6 = pfVar2->cmp_func_list;
  if (plVar6 != (list *)0x0) {
    (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)0x0;
    (handle->kvs_config).custom_cmp_param = (void *)0x0;
    for (plVar7 = plVar6->head; plVar7 != (list_elem *)0x0; plVar7 = plVar7->next) {
      plVar8 = plVar7[-2].next;
      if (plVar8 == (list_elem *)0x0) {
        pkVar18 = pfVar3->kv_header;
LAB_001316d7:
        plVar8 = plVar7[-1].prev;
        (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)plVar8;
        plVar9 = plVar7[-1].next;
        (handle->kvs_config).custom_cmp_param = plVar9;
        pkVar18->default_kvs_cmp = (fdb_custom_cmp_variable)plVar8;
        pkVar18->default_kvs_cmp_param = plVar9;
LAB_001316ef:
        pkVar18->custom_cmp_enabled = '\x01';
      }
      else {
        iVar13 = strcmp((char *)plVar8,"default");
        pkVar18 = pfVar3->kv_header;
        if (iVar13 == 0) goto LAB_001316d7;
        query.kvs_name = (char *)plVar8;
        paVar15 = avl_search(pkVar18->idx_name,&query.avl_name,_kvs_cmp_name);
        if (paVar15 != (avl_node *)0x0) {
          if (paVar15[-6].right == (avl_node *)0x0) {
            paVar12 = (avl_node *)plVar7[-1].next;
            paVar15[-6].right = (avl_node *)plVar7[-1].prev;
            paVar15[-5].parent = paVar12;
          }
          pkVar18 = pfVar3->kv_header;
          goto LAB_001316ef;
        }
      }
    }
  }
  uVar10 = pfVar2->flags;
  if ((uVar10 & 2) == 0) {
    pkVar18 = pfVar3->kv_header;
  }
  else {
    p_Var11 = (handle->kvs_config).custom_cmp;
    pkVar18 = pfVar3->kv_header;
    if ((uVar10 & 4) == 0) {
      if (p_Var11 != (fdb_custom_cmp_variable)0x0) {
        pkVar18->custom_cmp_enabled = uVar1;
        pkVar18->default_kvs_cmp = p_Var4;
        pkVar18->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar18->lock);
        pcVar17 = _fdb_kvs_get_name(handle,handle->file);
        pcVar19 = "default";
        if (pcVar17 != (char *)0x0) {
          pcVar19 = pcVar17;
        }
        pcVar17 = 
        "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
        ;
        line_number = 0x1a2;
        goto LAB_00131931;
      }
    }
    else if (p_Var11 == (fdb_custom_cmp_variable)0x0) {
      pkVar18->custom_cmp_enabled = uVar1;
      pkVar18->default_kvs_cmp = p_Var4;
      pkVar18->default_kvs_cmp_param = pvVar5;
      pthread_spin_unlock(&pkVar18->lock);
      pcVar17 = _fdb_kvs_get_name(handle,handle->file);
      pcVar19 = "default";
      if (pcVar17 != (char *)0x0) {
        pcVar19 = pcVar17;
      }
      pcVar17 = 
      "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
      ;
      line_number = 400;
      goto LAB_00131931;
    }
  }
  paVar15 = avl_first(pkVar18->idx_name);
  do {
    while( true ) {
      if (paVar15 == (avl_node *)0x0) {
        pthread_spin_unlock(&pfVar3->kv_header->lock);
        return FDB_RESULT_SUCCESS;
      }
      paVar16 = avl_next(paVar15);
      paVar12 = paVar15 + -6;
      if (((ulong)paVar15[-6].left & 1) != 0) break;
      paVar15 = paVar16;
      if (paVar12->right != (avl_node *)0x0) {
        pkVar18 = pfVar3->kv_header;
        pkVar18->custom_cmp_enabled = uVar1;
        pkVar18->default_kvs_cmp = p_Var4;
        pkVar18->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar18->lock);
        pcVar17 = _fdb_kvs_get_name(handle,handle->file);
        pcVar19 = "default";
        if (pcVar17 != (char *)0x0) {
          pcVar19 = pcVar17;
        }
        pcVar17 = 
        "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
        ;
        line_number = 0x1ce;
        goto LAB_00131931;
      }
    }
    paVar15 = paVar16;
  } while (paVar12->right != (avl_node *)0x0);
  pkVar18 = pfVar3->kv_header;
  pkVar18->custom_cmp_enabled = uVar1;
  pkVar18->default_kvs_cmp = p_Var4;
  pkVar18->default_kvs_cmp_param = pvVar5;
  pthread_spin_unlock(&pkVar18->lock);
  pcVar17 = _fdb_kvs_get_name(handle,handle->file);
  pcVar19 = "default";
  if (pcVar17 != (char *)0x0) {
    pcVar19 = pcVar17;
  }
  pcVar17 = 
  "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
  ;
  line_number = 0x1bc;
LAB_00131931:
  fVar14 = fdb_log_impl(&handle->log_callback,2,FDB_RESULT_INVALID_CMP_FUNCTION,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                        ,"fdb_kvs_cmp_check",line_number,pcVar17,pcVar19);
  return fVar14;
}

Assistant:

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)
{
    int ori_flag;
    fdb_file_handle *fhandle = handle->fhandle;
    fdb_custom_cmp_variable ori_custom_cmp;
    void* ori_custom_param;
    struct filemgr *file = handle->file;
    struct cmp_func_node *cmp_node;
    struct kvs_node *kvs_node, query;
    struct list_elem *e;
    struct avl_node *a;

    spin_lock(&file->kv_header->lock);
    ori_flag = file->kv_header->custom_cmp_enabled;
    ori_custom_cmp = file->kv_header->default_kvs_cmp;
    ori_custom_param = file->kv_header->default_kvs_cmp_param;

    // Assign from `fhandle->cmp_func_list` to `file->kv_header`.
    if (fhandle->cmp_func_list) {
        handle->kvs_config.custom_cmp = NULL;
        handle->kvs_config.custom_cmp_param = NULL;

        e = list_begin(fhandle->cmp_func_list);
        while (e) {
            cmp_node = _get_entry(e, struct cmp_func_node, le);
            if ( cmp_node->kvs_name == NULL ||
                 !strcmp(cmp_node->kvs_name, default_kvs_name) ) { // default KVS
                handle->kvs_config.custom_cmp = cmp_node->func;
                handle->kvs_config.custom_cmp_param = cmp_node->user_param;
                file->kv_header->default_kvs_cmp = cmp_node->func;
                file->kv_header->default_kvs_cmp_param = cmp_node->user_param;
                file->kv_header->custom_cmp_enabled = 1;
            } else {
                // search by name
                query.kvs_name = cmp_node->kvs_name;
                a = avl_search(file->kv_header->idx_name,
                               &query.avl_name,
                               _kvs_cmp_name);
                if (a) { // found
                    kvs_node = _get_entry(a, struct kvs_node, avl_name);
                    if (!kvs_node->custom_cmp) {
                        kvs_node->custom_cmp = cmp_node->func;
                        kvs_node->user_param = cmp_node->user_param;
                    }
                    file->kv_header->custom_cmp_enabled = 1;
                }
            }
            e = list_next(&cmp_node->le);
        }
    }

    // first check the default KVS
    // 1. root handle has not been opened yet: don't care
    // 2. root handle was opened before: must match the flag
    if (fhandle->flags & FHANDLE_ROOT_INITIALIZED) {
        if (fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP &&
            handle->kvs_config.custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP) &&
              handle->kvs_config.custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                    kvs_name);
        }
    }

    // next check other KVSs
    a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);

        if (kvs_node->flags & KVS_FLAG_CUSTOM_CMP &&
            kvs_node->custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(kvs_node->flags & KVS_FLAG_CUSTOM_CMP) &&
              kvs_node->custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                           kvs_name);
        }
    }

    spin_unlock(&file->kv_header->lock);
    return FDB_RESULT_SUCCESS;
}